

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O0

VW_HANDLE VW_SeedWithModel(VW_HANDLE handle,char *extraArgs)

{
  vw *pvVar1;
  char *in_RSI;
  undefined8 in_RDI;
  vw *newmodel;
  vw *origmodel;
  string s;
  void *in_stack_00000208;
  trace_message_t in_stack_00000210;
  string *in_stack_00000218;
  vw *in_stack_00000220;
  string local_78 [32];
  vw *local_58;
  undefined8 local_50;
  allocator local_31;
  string local_30 [40];
  undefined8 local_8;
  
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,in_RSI,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_50 = local_8;
  std::__cxx11::string::string(local_78,local_30);
  pvVar1 = VW::seed_vw_model(in_stack_00000220,in_stack_00000218,in_stack_00000210,in_stack_00000208
                            );
  std::__cxx11::string::~string(local_78);
  local_58 = pvVar1;
  std::__cxx11::string::~string(local_30);
  return pvVar1;
}

Assistant:

VW_DLL_MEMBER VW_HANDLE VW_CALLING_CONV VW_SeedWithModel(VW_HANDLE handle, const char * extraArgs)
{
  string s(extraArgs);
  vw* origmodel = static_cast<vw*>(handle);
  vw* newmodel = VW::seed_vw_model(origmodel, s);
  return static_cast<VW_HANDLE>(newmodel);
}